

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall Jupiter::Socket::~Socket(Socket *this)

{
  Socket *this_local;
  
  ~Socket(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

Jupiter::Socket::~Socket() {
	if (m_data != nullptr) {
		if (m_data->rawSock > 0)
			Jupiter::Socket::close();
		delete m_data;
	}
}